

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_uqsub_d_aarch64(void *vd,void *vq,void *vn,void *vm,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  uintptr_t opr_sz;
  uintptr_t max_sz;
  uint32_t *qc;
  uint64_t dd;
  uint64_t mm;
  uint64_t nn;
  _Bool q;
  uint64_t *m;
  uint64_t *n;
  uint64_t *d;
  intptr_t oprsz;
  intptr_t i;
  uint32_t desc_local;
  void *vm_local;
  void *vn_local;
  void *vq_local;
  void *vd_local;
  
  opr_sz = simd_oprsz(desc);
  bVar3 = false;
  for (oprsz = 0; oprsz < (long)opr_sz / 8; oprsz = oprsz + 1) {
    uVar1 = *(ulong *)((long)vn + oprsz * 8);
    uVar2 = *(ulong *)((long)vm + oprsz * 8);
    qc = (uint32_t *)(uVar1 - uVar2);
    if (uVar1 < uVar2) {
      qc = (uint32_t *)0x0;
      bVar3 = true;
    }
    *(uint32_t **)((long)vd + oprsz * 8) = qc;
  }
  if (bVar3) {
    *(undefined4 *)vq = 1;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz,max_sz);
  return;
}

Assistant:

void HELPER(gvec_uqsub_d)(void *vd, void *vq, void *vn,
                          void *vm, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    uint64_t *d = vd, *n = vn, *m = vm;
    bool q = false;

    for (i = 0; i < oprsz / 8; i++) {
        uint64_t nn = n[i], mm = m[i], dd = nn - mm;
        if (nn < mm) {
            dd = 0;
            q = true;
        }
        d[i] = dd;
    }
    if (q) {
        uint32_t *qc = vq;
        qc[0] = 1;
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}